

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchMan.c
# Opt level: O0

void Dch_ManPrintStats(Dch_Man_t *p)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int nNodeNum;
  Dch_Man_t *p_local;
  
  iVar1 = Aig_ManNodeNum(p->pAigTotal);
  uVar2 = iVar1 / 3;
  Abc_Print(1,"Parameters: Sim words = %d. Conf limit = %d. SAT var max = %d.\n",
            (ulong)(uint)p->pPars->nWords,(ulong)(uint)p->pPars->nBTLimit,
            (ulong)(uint)p->pPars->nSatVarMax);
  uVar3 = Aig_ManNodeNum(p->pAigTotal);
  iVar1 = Aig_ManNodeNum(p->pAigTotal);
  iVar4 = Aig_ManNodeNum(p->pAigTotal);
  Abc_Print(1,"AIG nodes : Total = %6d. Dangling = %6d. Main = %6d. (%6.2f %%)\n",
            ((double)(int)uVar2 * 100.0) / (double)iVar4,(ulong)uVar3,(ulong)(iVar1 - uVar2),
            (ulong)uVar2);
  Abc_Print(1,"SAT solver: Vars = %d. Max cone = %d. Recycles = %d.\n",(ulong)(uint)p->nSatVars,
            (ulong)(uint)p->nConeMax,(ulong)(uint)p->nRecycles);
  Abc_Print(1,"SAT calls : All = %6d. Unsat = %6d. Sat = %6d. Fail = %6d.\n",
            (ulong)(uint)p->nSatCalls,
            (ulong)(uint)((p->nSatCalls - p->nSatCallsSat) - p->nSatFailsReal),
            (ulong)(uint)p->nSatCallsSat,(ulong)(uint)p->nSatFailsReal);
  Abc_Print(1,"Choices   : Lits = %6d. Reprs = %5d. Equivs = %5d. Choices = %5d.\n",
            (ulong)(uint)p->nLits,(ulong)(uint)p->nReprs,(ulong)(uint)p->nEquivs,
            (ulong)(uint)p->nChoices);
  Abc_Print(1,"Choicing runtime statistics:\n");
  p->timeOther = (((p->timeTotal - p->timeSimInit) - p->timeSimSat) - p->timeSat) - p->timeChoice;
  Abc_PrintTimeP(1,"Sim init   ",p->timeSimInit,p->timeTotal);
  Abc_PrintTimeP(1,"Sim SAT    ",p->timeSimSat,p->timeTotal);
  Abc_PrintTimeP(1,"SAT solving",p->timeSat,p->timeTotal);
  Abc_PrintTimeP(1,"  sat      ",p->timeSatSat,p->timeTotal);
  Abc_PrintTimeP(1,"  unsat    ",p->timeSatUnsat,p->timeTotal);
  Abc_PrintTimeP(1,"  undecided",p->timeSatUndec,p->timeTotal);
  Abc_PrintTimeP(1,"Choice     ",p->timeChoice,p->timeTotal);
  Abc_PrintTimeP(1,"Other      ",p->timeOther,p->timeTotal);
  Abc_PrintTimeP(1,"TOTAL      ",p->timeTotal,p->timeTotal);
  if (p->pPars->timeSynth != 0) {
    Abc_PrintTime(1,"Synthesis  ",p->pPars->timeSynth);
  }
  return;
}

Assistant:

void Dch_ManPrintStats( Dch_Man_t * p )
{
    int nNodeNum = Aig_ManNodeNum(p->pAigTotal) / 3;
    Abc_Print( 1, "Parameters: Sim words = %d. Conf limit = %d. SAT var max = %d.\n", 
        p->pPars->nWords, p->pPars->nBTLimit, p->pPars->nSatVarMax );
    Abc_Print( 1, "AIG nodes : Total = %6d. Dangling = %6d. Main = %6d. (%6.2f %%)\n", 
        Aig_ManNodeNum(p->pAigTotal), 
        Aig_ManNodeNum(p->pAigTotal)-nNodeNum,
        nNodeNum,
        100.0 * nNodeNum/Aig_ManNodeNum(p->pAigTotal) );
    Abc_Print( 1, "SAT solver: Vars = %d. Max cone = %d. Recycles = %d.\n", 
        p->nSatVars, p->nConeMax, p->nRecycles );
    Abc_Print( 1, "SAT calls : All = %6d. Unsat = %6d. Sat = %6d. Fail = %6d.\n", 
        p->nSatCalls, p->nSatCalls-p->nSatCallsSat-p->nSatFailsReal, 
        p->nSatCallsSat, p->nSatFailsReal );
    Abc_Print( 1, "Choices   : Lits = %6d. Reprs = %5d. Equivs = %5d. Choices = %5d.\n", 
        p->nLits, p->nReprs, p->nEquivs, p->nChoices );
    Abc_Print( 1, "Choicing runtime statistics:\n" );
    p->timeOther = p->timeTotal-p->timeSimInit-p->timeSimSat-p->timeSat-p->timeChoice;
    Abc_PrintTimeP( 1, "Sim init   ", p->timeSimInit,  p->timeTotal );
    Abc_PrintTimeP( 1, "Sim SAT    ", p->timeSimSat,   p->timeTotal );
    Abc_PrintTimeP( 1, "SAT solving", p->timeSat,      p->timeTotal );
    Abc_PrintTimeP( 1, "  sat      ", p->timeSatSat,   p->timeTotal );
    Abc_PrintTimeP( 1, "  unsat    ", p->timeSatUnsat, p->timeTotal );
    Abc_PrintTimeP( 1, "  undecided", p->timeSatUndec, p->timeTotal );
    Abc_PrintTimeP( 1, "Choice     ", p->timeChoice,   p->timeTotal );
    Abc_PrintTimeP( 1, "Other      ", p->timeOther,    p->timeTotal );
    Abc_PrintTimeP( 1, "TOTAL      ", p->timeTotal,    p->timeTotal );
    if ( p->pPars->timeSynth )
    {
    Abc_PrintTime( 1, "Synthesis  ", p->pPars->timeSynth );
    }
}